

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t hd_strlcat(char *dst,char *src,size_t siz)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  size_t dlen;
  size_t n;
  char *s;
  char *d;
  size_t siz_local;
  char *src_local;
  char *dst_local;
  
  dlen = siz;
  s = dst;
  while( true ) {
    sVar1 = dlen;
    if (*s != '\0') {
      dlen = dlen - 1;
    }
    if (*s == '\0' || sVar1 == 0) break;
    s = s + 1;
  }
  lVar2 = (long)s - (long)dst;
  dlen = siz - lVar2;
  n = (size_t)src;
  if (dlen == 0) {
    sVar3 = strlen(src);
  }
  else {
    for (; *(char *)n != '\0'; n = n + 1) {
      if (dlen != 1) {
        *s = *(char *)n;
        dlen = dlen - 1;
        s = s + 1;
      }
    }
    *s = '\0';
    sVar3 = n - (long)src;
  }
  dst_local = (char *)(lVar2 + sVar3);
  return (size_t)dst_local;
}

Assistant:

size_t
hd_strlcat(char *dst, const char *src, size_t siz)
{
	register char *d = dst;
	register const char *s = src;
	register size_t n = siz;
	size_t dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (*d != '\0' && n-- != 0)
		d++;
	dlen = d - dst;
	n = siz - dlen;

	if (n == 0)
		return dlen + strlen(s);
	while (*s != '\0') {
		if (n != 1) {
			*d++ = *s;
			n--;
		}
		s++;
	}
	*d = '\0';

	return dlen + (s - src);	/* count does not include NUL */
}